

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

bool ImGui::IsMouseHoveringRect(ImVec2 *r_min,ImVec2 *r_max,bool clip)

{
  bool bVar1;
  ImVec2 local_60;
  ImVec2 local_58;
  undefined1 local_50 [8];
  ImRect rect_for_touch;
  ImRect rect_clipped;
  ImGuiContext *g;
  bool clip_local;
  ImVec2 *r_max_local;
  ImVec2 *r_min_local;
  
  rect_clipped.Max = (ImVec2)GImGui;
  ImRect::ImRect((ImRect *)&rect_for_touch.Max,r_min,r_max);
  if (clip) {
    ImRect::ClipWith((ImRect *)&rect_for_touch.Max,
                     (ImRect *)(*(long *)((long)rect_clipped.Max + 0x1c10) + 0x250));
  }
  local_58 = operator-(&rect_for_touch.Max,(ImVec2 *)((long)rect_clipped.Max + 0x15c0));
  local_60 = ::operator+(&rect_clipped.Min,(ImVec2 *)((long)rect_clipped.Max + 0x15c0));
  ImRect::ImRect((ImRect *)local_50,&local_58,&local_60);
  bVar1 = ImRect::Contains((ImRect *)local_50,(ImVec2 *)((long)rect_clipped.Max + 0x128));
  return bVar1;
}

Assistant:

bool ImGui::IsMouseHoveringRect(const ImVec2& r_min, const ImVec2& r_max, bool clip)
{
    ImGuiContext& g = *GImGui;

    // Clip
    ImRect rect_clipped(r_min, r_max);
    if (clip)
        rect_clipped.ClipWith(g.CurrentWindow->ClipRect);

    // Expand for touch input
    const ImRect rect_for_touch(rect_clipped.Min - g.Style.TouchExtraPadding, rect_clipped.Max + g.Style.TouchExtraPadding);
    if (!rect_for_touch.Contains(g.IO.MousePos))
        return false;
    return true;
}